

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<const_int> * __thiscall
kj::heapArray<int_const,int_const*>
          (Array<const_int> *__return_storage_ptr__,kj *this,int *begin,int *end)

{
  int *piVar1;
  long lVar2;
  Array<const_int> *result;
  ArrayBuilder<const_int> local_38;
  
  piVar1 = _::HeapArrayDisposer::allocateUninitialized<int>((long)begin - (long)this >> 2);
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  for (lVar2 = 0; this + lVar2 != (kj *)begin; lVar2 = lVar2 + 4) {
    *(int *)((long)piVar1 + lVar2) = *(int *)(this + lVar2);
  }
  __return_storage_ptr__->ptr = piVar1;
  __return_storage_ptr__->size_ = lVar2 >> 2;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_38.ptr = (int *)0x0;
  local_38.pos = (RemoveConst<const_int> *)0x0;
  local_38.endPtr = (int *)0x0;
  ArrayBuilder<const_int>::dispose(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Array<T>
heapArray(Iterator begin, Iterator end) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(end - begin);
  builder.addAll(begin, end);
  return builder.finish();
}